

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcElementType::~IfcElementType(IfcElementType *this)

{
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcTypeProduct).super_IfcTypeObject + -0x18);
  pvVar1 = &this->field_0x168 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x168) = 0x8a09f8;
  *(undefined8 *)((long)pvVar1 + 0x18) = 0x8a0ac0;
  *(undefined8 *)((long)pvVar1 + -0xe0) = 0x8a0a20;
  *(undefined8 *)((long)pvVar1 + -0xd0) = 0x8a0a48;
  *(undefined8 *)((long)pvVar1 + -0x78) = 0x8a0a70;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x8a0a98;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)(&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x0 + lVar2)
             ,&PTR_construction_vtable_24__008a0ad8);
  return;
}

Assistant:

IfcElementType() : Object("IfcElementType") {}